

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNUnit.cpp
# Opt level: O1

uint __thiscall NaNNUnit::Neurons(NaNNUnit *this,uint iLayer)

{
  uint uVar1;
  undefined4 *puVar2;
  uint *puVar3;
  
  uVar1 = (this->descr).nHidLayers;
  if (iLayer < uVar1) {
    puVar3 = (this->descr).nHidNeurons + iLayer;
  }
  else {
    if (uVar1 != iLayer) {
      puVar2 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar2 = 1;
      __cxa_throw(puVar2,&NaException::typeinfo,0);
    }
    puVar3 = &(this->descr).nOutNeurons;
  }
  return *puVar3;
}

Assistant:

unsigned
NaNNUnit::Neurons (unsigned iLayer) const
{
    if(iLayer < Layers() - 1)
        return descr.nHidNeurons[iLayer];
    else if(iLayer == Layers() - 1)
        return descr.nOutNeurons;

    throw(na_out_of_range);

    /* make compiler happy */
    return 0;
}